

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

size_t fio_local_addr(char *dest,size_t limit)

{
  char *__s;
  int iVar1;
  addrinfo *paVar2;
  size_t sVar3;
  size_t unaff_R15;
  addrinfo *info;
  addrinfo *local_60;
  addrinfo local_58;
  
  iVar1 = gethostname(dest,limit);
  if (iVar1 == 0) {
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    local_58.ai_flags = 2;
    local_58.ai_family = 0;
    iVar1 = getaddrinfo(dest,"http",&local_58,&local_60);
    paVar2 = local_60;
    if (iVar1 == 0) {
      for (; paVar2 != (addrinfo *)0x0; paVar2 = paVar2->ai_next) {
        __s = paVar2->ai_canonname;
        if (__s != (char *)0x0) {
          sVar3 = strlen(__s);
          unaff_R15 = limit - 1;
          if (sVar3 < limit) {
            unaff_R15 = sVar3;
          }
          memcpy(dest,__s,unaff_R15);
          dest[unaff_R15] = '\0';
          freeaddrinfo(local_60);
          break;
        }
      }
      if (paVar2 != (addrinfo *)0x0) {
        return unaff_R15;
      }
      freeaddrinfo(local_60);
    }
  }
  return 0;
}

Assistant:

size_t fio_local_addr(char *dest, size_t limit) {
  if (gethostname(dest, limit))
    return 0;

  struct addrinfo hints, *info;
  memset(&hints, 0, sizeof hints);
  hints.ai_family = AF_UNSPEC;     // don't care IPv4 or IPv6
  hints.ai_socktype = SOCK_STREAM; // TCP stream sockets
  hints.ai_flags = AI_CANONNAME;   // get cannonical name

  if (getaddrinfo(dest, "http", &hints, &info) != 0)
    return 0;

  for (struct addrinfo *pos = info; pos; pos = pos->ai_next) {
    if (pos->ai_canonname) {
      size_t len = strlen(pos->ai_canonname);
      if (len >= limit)
        len = limit - 1;
      memcpy(dest, pos->ai_canonname, len);
      dest[len] = 0;
      freeaddrinfo(info);
      return len;
    }
  }

  freeaddrinfo(info);
  return 0;
}